

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

_Bool opensshcert_check_cert
                (ssh_key *key,_Bool host,ptrlen principal,uint64_t time,ca_options *opts,
                BinarySink *error)

{
  _Bool _Var1;
  int iVar2;
  opensshcert_key *ck_00;
  strbuf *sb;
  ssh_keyalg *psVar3;
  char *pcVar4;
  ptrlen pVar5;
  ptrlen pVar6;
  ptrlen data;
  ptrlen option;
  ptrlen valid_principal_1;
  char *sep;
  ptrlen valid_principal;
  uint32_t expected_type;
  ssh_keyalg *sig_alg;
  ptrlen signature;
  BinarySource src [1];
  strbuf *preimage;
  ssh_key *ca_key;
  _Bool result;
  opensshcert_key *ck;
  ca_options *opts_local;
  uint64_t time_local;
  _Bool host_local;
  ssh_key *key_local;
  ptrlen principal_local;
  
  ck_00 = (opensshcert_key *)(key + -0xd);
  ca_key._7_1_ = false;
  sb = strbuf_new();
  pVar5 = ptrlen_from_strbuf((strbuf *)key[-2].vt);
  pVar6 = make_ptrlen((void *)0x0,0);
  preimage = (strbuf *)opensshcert_ca_pub_key(ck_00,pVar6,(ptrlen *)0x0);
  if (preimage == (strbuf *)0x0) {
    BinarySink_put_fmt(error->binarysink_,"Certificate\'s signing key is invalid");
  }
  else {
    psVar3 = ssh_key_alg((ssh_key *)preimage);
    if ((psVar3->is_certificate & 1U) == 0) {
      ssh_key_free((ssh_key *)preimage);
      preimage = (strbuf *)opensshcert_ca_pub_key(ck_00,pVar5,(ptrlen *)0x0);
      if (preimage == (strbuf *)0x0) {
        BinarySink_put_fmt(error->binarysink_,
                           "Certificate\'s signing key does not match signature type");
      }
      else {
        psVar3 = ssh_key_alg((ssh_key *)preimage);
        if ((((psVar3 == &ssh_rsa) && ((opts->permit_rsa_sha1 & 1U) == 0)) ||
            ((psVar3 == &ssh_rsa_sha256 && ((opts->permit_rsa_sha256 & 1U) == 0)))) ||
           ((psVar3 == &ssh_rsa_sha512 && ((opts->permit_rsa_sha512 & 1U) == 0)))) {
          BinarySink_put_fmt(error->binarysink_,
                             "Certificate signature uses \'%s\' signature type (forbidden by user configuration)"
                             ,psVar3->ssh_id);
        }
        else {
          opensshcert_signature_preimage(ck_00,sb->binarysink_);
          pVar6 = ptrlen_from_strbuf(sb);
          _Var1 = ssh_key_verify((ssh_key *)preimage,pVar5,pVar6);
          if (_Var1) {
            iVar2 = 1;
            if (host) {
              iVar2 = 2;
            }
            if (*(int *)&key[-0xb].vt == iVar2) {
              if (time < key[-8].vt) {
                BinarySink_put_fmt(error->binarysink_,"Certificate is not valid until ");
                opensshcert_time_to_iso8601(error->binarysink_,time);
              }
              else if (time < key[-7].vt) {
                if ((key[-9].vt)->new_priv_openssh !=
                    (_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)0x0) {
                  pVar5 = ptrlen_from_strbuf((strbuf *)key[-9].vt);
                  BinarySource_INIT__((BinarySource *)&signature.len,pVar5);
                  do {
                    if (*(long *)(src[0]._24_8_ + 0x10) == *(long *)(src[0]._24_8_ + 8)) {
                      pcVar4 = "username";
                      if (host) {
                        pcVar4 = "hostname";
                      }
                      BinarySink_put_fmt(error->binarysink_,"Certificate\'s %s list [",pcVar4);
                      pVar5 = ptrlen_from_strbuf((strbuf *)key[-9].vt);
                      BinarySource_INIT__((BinarySource *)&signature.len,pVar5);
                      valid_principal_1.len = (long)"\n\n" + 2;
                      while (*(long *)(src[0]._24_8_ + 0x10) != *(long *)(src[0]._24_8_ + 8)) {
                        pVar5 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
                        BinarySink_put_fmt(error->binarysink_,"%s\"",valid_principal_1.len);
                        BinarySink_put_c_string_literal(error->binarysink_,pVar5);
                        BinarySink_put_fmt(error->binarysink_,"\"");
                        valid_principal_1.len = (size_t)anon_var_dwarf_53f;
                      }
                      pcVar4 = "username";
                      if (host) {
                        pcVar4 = "hostname";
                      }
                      BinarySink_put_fmt(error->binarysink_,"] does not contain expected %s \"",
                                         pcVar4);
                      BinarySink_put_c_string_literal(error->binarysink_,principal);
                      BinarySink_put_fmt(error->binarysink_,"\"");
                      goto LAB_001411ec;
                    }
                    pVar5 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
                    if (*(int *)(src[0]._24_8_ + 0x18) != 0) {
                      BinarySink_put_fmt(error->binarysink_,
                                         "Certificate\'s valid principals list is incorrectly formatted"
                                        );
                      goto LAB_001411ec;
                    }
                    _Var1 = ptrlen_eq_ptrlen(pVar5,principal);
                  } while (!_Var1);
                }
                pVar5 = ptrlen_from_strbuf((strbuf *)key[-6].vt);
                BinarySource_INIT__((BinarySource *)&signature.len,pVar5);
                if (*(long *)(src[0]._24_8_ + 0x10) == *(long *)(src[0]._24_8_ + 8)) {
                  ca_key._7_1_ = true;
                }
                else {
                  pVar5 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
                  BinarySource_get_string((BinarySource *)src[0]._24_8_);
                  if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
                    BinarySink_put_fmt(error->binarysink_,
                                       "Certificate specifies an unsupported critical option \"");
                    BinarySink_put_c_string_literal(error->binarysink_,pVar5);
                    BinarySink_put_fmt(error->binarysink_,"\"");
                  }
                  else {
                    BinarySink_put_fmt(error->binarysink_,
                                       "Certificate\'s critical options list is incorrectly formatted"
                                      );
                  }
                }
              }
              else {
                BinarySink_put_fmt(error->binarysink_,"Certificate expired at ");
                opensshcert_time_to_iso8601(error->binarysink_,time);
              }
            }
            else {
              BinarySink_put_fmt(error->binarysink_,"Certificate type is ");
              if (*(int *)&key[-0xb].vt == 1) {
                BinarySink_put_fmt(error->binarysink_,"user");
              }
              else if (*(int *)&key[-0xb].vt == 2) {
                BinarySink_put_fmt(error->binarysink_,"host");
              }
              else {
                BinarySink_put_fmt(error->binarysink_,"unknown value %u",
                                   (ulong)*(uint *)&key[-0xb].vt);
              }
              pcVar4 = "user";
              if (host) {
                pcVar4 = "host";
              }
              BinarySink_put_fmt(error->binarysink_,"; expected %s",pcVar4);
            }
          }
          else {
            BinarySink_put_fmt(error->binarysink_,"Certificate\'s signature is invalid");
          }
        }
      }
    }
    else {
      BinarySink_put_fmt(error->binarysink_,
                         "Certificate is signed with a certified key (forbidden by OpenSSH certificate specification)"
                        );
    }
  }
LAB_001411ec:
  if (preimage != (strbuf *)0x0) {
    ssh_key_free((ssh_key *)preimage);
  }
  strbuf_free(sb);
  return ca_key._7_1_;
}

Assistant:

static bool opensshcert_check_cert(
    ssh_key *key, bool host, ptrlen principal, uint64_t time,
    const ca_options *opts, BinarySink *error)
{
    opensshcert_key *ck = container_of(key, opensshcert_key, sshk);
    bool result = false;
    ssh_key *ca_key = NULL;
    strbuf *preimage = strbuf_new();
    BinarySource src[1];

    ptrlen signature = ptrlen_from_strbuf(ck->signature);

    /*
     * The OpenSSH certificate spec is one-layer only: it explicitly
     * forbids using a certified key in turn as the CA.
     *
     * If it did not, then we'd also have to recursively verify
     * everything up the CA chain until we reached the ultimate root,
     * and then make sure _that_ was something we trusted. (Not to
     * mention that there'd probably be an additional SSH_CERT_TYPE_CA
     * or some such, and certificate options saying what kinds of
     * certificate a CA was trusted to sign for, and ...)
     */
    ca_key = opensshcert_ca_pub_key(ck, make_ptrlen(NULL, 0), NULL);
    if (!ca_key) {
        put_fmt(error, "Certificate's signing key is invalid");
        goto out;
    }
    if (ssh_key_alg(ca_key)->is_certificate) {
        put_fmt(error, "Certificate is signed with a certified key "
                "(forbidden by OpenSSH certificate specification)");
        goto out;
    }

    /*
     * Now re-instantiate the key in a way that matches the signature
     * (i.e. so that if the key is an RSA one we get the right subtype
     * of RSA).
     */
    ssh_key_free(ca_key);
    ca_key = opensshcert_ca_pub_key(ck, signature, NULL);
    if (!ca_key) {
        put_fmt(error, "Certificate's signing key does not match "
                "signature type");
        goto out;
    }

    /* Check which signature algorithm is actually in use, because
     * that might be a reason to reject the certificate (e.g. ssh-rsa
     * when we wanted rsa-sha2-*). */
    const ssh_keyalg *sig_alg = ssh_key_alg(ca_key);
    if ((sig_alg == &ssh_rsa && !opts->permit_rsa_sha1) ||
        (sig_alg == &ssh_rsa_sha256 && !opts->permit_rsa_sha256) ||
        (sig_alg == &ssh_rsa_sha512 && !opts->permit_rsa_sha512)) {
        put_fmt(error, "Certificate signature uses '%s' signature type "
                "(forbidden by user configuration)", sig_alg->ssh_id);
        goto out;
    }

    opensshcert_signature_preimage(ck, BinarySink_UPCAST(preimage));

    if (!ssh_key_verify(ca_key, signature, ptrlen_from_strbuf(preimage))) {
        put_fmt(error, "Certificate's signature is invalid");
        goto out;
    }

    uint32_t expected_type = host ? SSH_CERT_TYPE_HOST : SSH_CERT_TYPE_USER;
    if (ck->type != expected_type) {
        put_fmt(error, "Certificate type is ");
        switch (ck->type) {
          case SSH_CERT_TYPE_HOST:
            put_fmt(error, "host");
            break;
          case SSH_CERT_TYPE_USER:
            put_fmt(error, "user");
            break;
          default:
            put_fmt(error, "unknown value %" PRIu32, ck->type);
            break;
        }
        put_fmt(error, "; expected %s", host ? "host" : "user");
        goto out;
    }

    /*
     * Check the time bounds on the certificate.
     */
    if (time < ck->valid_after) {
        put_fmt(error, "Certificate is not valid until ");
        opensshcert_time_to_iso8601(BinarySink_UPCAST(error), time);
        goto out;
    }
    if (time >= ck->valid_before) {
        put_fmt(error, "Certificate expired at ");
        opensshcert_time_to_iso8601(BinarySink_UPCAST(error), time);
        goto out;
    }

    /*
     * Check that this certificate is for the right thing.
     *
     * If valid_principals is a zero-length string then this is
     * specified to be a carte-blanche certificate valid for any
     * principal (at least, provided you trust the CA that issued it).
     */
    if (ck->valid_principals->len != 0) {
        BinarySource_BARE_INIT_PL(
            src, ptrlen_from_strbuf(ck->valid_principals));

        while (get_avail(src)) {
            ptrlen valid_principal = get_string(src);
            if (get_err(src)) {
                put_fmt(error, "Certificate's valid principals list is "
                        "incorrectly formatted");
                goto out;
            }
            if (ptrlen_eq_ptrlen(valid_principal, principal))
                goto principal_ok;
        }

        /*
         * No valid principal matched. Now go through the list a
         * second time writing the cert contents into the error
         * message, so that the user can see at a glance what went
         * wrong.
         *
         * (If you've typed the wrong spelling of the host name, you
         * really need to see "This cert is for 'foo.example.com' and
         * I was trying to match it against 'foo'", rather than just
         * "Computer says no".)
         */
        put_fmt(error, "Certificate's %s list [",
                host ? "hostname" : "username");
        BinarySource_BARE_INIT_PL(
            src, ptrlen_from_strbuf(ck->valid_principals));
        const char *sep = "";
        while (get_avail(src)) {
            ptrlen valid_principal = get_string(src);
            put_fmt(error, "%s\"", sep);
            put_c_string_literal(error, valid_principal);
            put_fmt(error, "\"");
            sep = ", ";
        }
        put_fmt(error, "] does not contain expected %s \"",
                host ? "hostname" : "username");
        put_c_string_literal(error, principal);
        put_fmt(error, "\"");
        goto out;
      principal_ok:;
    }

    /*
     * Check for critical options.
     */
    {
        BinarySource_BARE_INIT_PL(
            src, ptrlen_from_strbuf(ck->critical_options));

        while (get_avail(src)) {
            ptrlen option = get_string(src);
            ptrlen data = get_string(src);
            if (get_err(src)) {
                put_fmt(error, "Certificate's critical options list is "
                        "incorrectly formatted");
                goto out;
            }

            /*
             * If we ever do support any options, this will be where
             * we insert code to recognise and validate them.
             *
             * At present, we implement no critical options at all.
             * (For host certs, as of 2022-04-20, OpenSSH hasn't
             * defined any. For user certs, the only SSH server using
             * this is Uppity, which doesn't support key restrictions
             * in general.)
             */
            (void)data; /* no options supported => no use made of the data */

            /*
             * Report an unrecognised literal.
             */
            put_fmt(error, "Certificate specifies an unsupported critical "
                    "option \"");
            put_c_string_literal(error, option);
            put_fmt(error, "\"");
            goto out;
        }
    }

    /* If we get here without failing any check, accept the certificate! */
    result = true;

  out:
    if (ca_key)
        ssh_key_free(ca_key);
    strbuf_free(preimage);
    return result;
}